

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWritePla.c
# Opt level: O0

int Io_WriteMoPlaM(Abc_Ntk_t *pNtk,char *pFileName,int nMints)

{
  char *pcVar1;
  int iVar2;
  FILE *__stream;
  char *pcVar3;
  FILE *pFile;
  int nMints_local;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    iVar2 = Abc_NtkIsBddLogic(pNtk);
    if (iVar2 == 0) {
      __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/io/ioWritePla.c"
                    ,0x230,"int Io_WriteMoPlaM(Abc_Ntk_t *, char *, int)");
    }
  }
  __stream = fopen(pFileName,"w");
  if (__stream != (FILE *)0x0) {
    pcVar1 = pNtk->pName;
    pcVar3 = Extra_TimeStamp();
    fprintf(__stream,"# Benchmark \"%s\" written by ABC on %s\n",pcVar1,pcVar3);
    Io_WriteMoPlaOneM((FILE *)__stream,pNtk,nMints);
    fclose(__stream);
  }
  else {
    fprintf(_stdout,"Io_WriteMoPlaM(): Cannot open the output file.\n");
  }
  pNtk_local._4_4_ = (uint)(__stream != (FILE *)0x0);
  return pNtk_local._4_4_;
}

Assistant:

int Io_WriteMoPlaM( Abc_Ntk_t * pNtk, char * pFileName, int nMints )
{
    FILE * pFile;
    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk) );
    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteMoPlaM(): Cannot open the output file.\n" );
        return 0;
    }
    fprintf( pFile, "# Benchmark \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );
    Io_WriteMoPlaOneM( pFile, pNtk, nMints );
    fclose( pFile );
    return 1;
}